

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O3

u32 __thiscall Counters::count2GetNext(Counters *this,u32 pos1,u32 *pos2)

{
  u32 uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = *pos2;
  uVar2 = *(ulong *)(this->count2High[pos1] + (uVar5 >> 1)) >> ((char)uVar5 * '\x04' & 4U);
  uVar3 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  uVar4 = uVar5 & 1 ^ 0xf;
  if (uVar2 != 0) {
    uVar4 = (uint)(uVar3 >> 2) & 0x3fffffff;
  }
  uVar5 = uVar4 + uVar5;
  uVar3 = uVar2 >> ((char)uVar4 * '\x04' & 0x3fU) & 0xf;
  *pos2 = uVar5;
  uVar1 = 0;
  if (uVar3 != 0 && uVar5 < 0x200) {
    uVar5 = (uint)this->count2Low[pos1][uVar5];
    uVar1 = ((int)uVar3 + -1 + (uint)(uVar5 == 0)) * 0x100 | uVar5;
  }
  return uVar1;
}

Assistant:

u32 count2GetNext(u32 pos1, u32 &pos2) { // note: we will advance pos2 to the next nonzero counter in register range
      // read 12-bits pairwise symbol counter, split into low 8-bits and high 4-bits number while skipping over zeros
	  u64 high = fsst_unaligned_load(&count2High[pos1][pos2>>1]);
      high >>= ((pos2&1) << 2); // odd pos2: ignore the lowest 4 bits & we see only 15 counters

      u32 zero = high?(__builtin_ctzll(high)>>2):(15UL-(pos2&1UL)); // number of zero 4-bits counters
      high = (high >> (zero << 2)) & 15;  // advance to nonzero counter
      if (((pos2 += zero) >= FSST_CODE_MAX) || !high) // SKIP! advance pos2
         return 0UL; // all zero

      u32 low = count2Low[pos1][pos2];
      if (low) high--; // high is incremented early and low late, so decrement high (unless low==0)
      return (u32) ((high << 8) + low);
   }